

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall
ASDCP::MXF::SoundfieldGroupLabelSubDescriptor::SoundfieldGroupLabelSubDescriptor
          (SoundfieldGroupLabelSubDescriptor *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  MDDEntry *pMVar3;
  
  MCALabelSubDescriptor::MCALabelSubDescriptor(&this->super_MCALabelSubDescriptor,d);
  (this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__SoundfieldGroupLabelSubDescriptor_002265f8;
  (this->GroupOfSoundfieldGroupsLinkID).m_property.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->GroupOfSoundfieldGroupsLinkID).m_property.
           super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
           super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
           super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->GroupOfSoundfieldGroupsLinkID).m_property.
           super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
           super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
           super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->GroupOfSoundfieldGroupsLinkID).m_property.
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_IArchive._vptr_IArchive = (_func_int **)&PTR__FixedSizeItemCollection_00224928;
  (this->GroupOfSoundfieldGroupsLinkID).m_has_value = false;
  this_00 = (this->super_MCALabelSubDescriptor).super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar3 = Dictionary::Type(this_00,MDD_SoundfieldGroupLabelSubDescriptor);
    uVar1 = *(undefined8 *)pMVar3->ul;
    uVar2 = *(undefined8 *)(pMVar3->ul + 8);
    (this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
    super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
     super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
      super_Identifier<16U>.m_Value + 8) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xfab,
                "ASDCP::MXF::SoundfieldGroupLabelSubDescriptor::SoundfieldGroupLabelSubDescriptor(const Dictionary *)"
               );
}

Assistant:

SoundfieldGroupLabelSubDescriptor::SoundfieldGroupLabelSubDescriptor(const Dictionary* d) : MCALabelSubDescriptor(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_SoundfieldGroupLabelSubDescriptor);
}